

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void setup_movable_items(tgestate_t *state)

{
  room_t rVar1;
  character_t character;
  long lVar2;
  
  reset_nonplayer_visible_characters(state);
  rVar1 = state->room_index;
  if (rVar1 == '\x02') {
    character = '\x1a';
    lVar2 = 0x128;
  }
  else if (rVar1 == '\t') {
    character = '\x1c';
    lVar2 = 0x140;
  }
  else {
    if (rVar1 != '\x04') goto LAB_001054c8;
    character = '\x1b';
    lVar2 = 0x158;
  }
  setup_movable_item(state,(movableitem_t *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x20),
                     character);
LAB_001054c8:
  spawn_characters(state);
  mark_nearby_items(state);
  animate(state);
  move_map(state);
  plot_sprites(state);
  return;
}

Assistant:

void setup_movable_items(tgestate_t *state)
{
  const movableitem_t *movableitem;
  character_t          character;

  assert(state != NULL);

  reset_nonplayer_visible_characters(state);

  /* Conv: Use a switch statement rather than if-else and gotos. */

  switch (state->room_index)
  {
  case room_2_HUT2LEFT:
    movableitem = &state->movable_items[movable_item_STOVE1];
    character   = character_26_STOVE_1;
    setup_movable_item(state, movableitem, character);
    break;

  case room_4_HUT3LEFT:
    movableitem = &state->movable_items[movable_item_STOVE2];
    character   = character_27_STOVE_2;
    setup_movable_item(state, movableitem, character);
    break;

  case room_9_CRATE:
    movableitem = &state->movable_items[movable_item_CRATE];
    character   = character_28_CRATE;
    setup_movable_item(state, movableitem, character);
    break;

  default:
    break;
  }

  spawn_characters(state);
  mark_nearby_items(state);
  animate(state);
  move_map(state);
  plot_sprites(state);
}